

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::ConsoleReporter::lazyPrintRunInfo(ConsoleReporter *this)

{
  bool bVar1;
  ostream *poVar2;
  string *psVar3;
  string *psVar4;
  long in_RDI;
  Colour colour;
  char *in_stack_ffffffffffffff68;
  Option<Catch::TestRunInfo> *in_stack_ffffffffffffff70;
  
  poVar2 = std::operator<<(*(ostream **)(in_RDI + 0x168),"\n");
  psVar3 = getTildes_abi_cxx11_();
  poVar2 = std::operator<<(poVar2,(string *)psVar3);
  std::operator<<(poVar2,"\n");
  Colour::Colour((Colour *)in_stack_ffffffffffffff70,
                 (Code)((ulong)in_stack_ffffffffffffff68 >> 0x20));
  poVar2 = *(ostream **)(in_RDI + 0x168);
  psVar4 = (string *)
           Option<Catch::TestRunInfo>::operator->((Option<Catch::TestRunInfo> *)(in_RDI + 0x18));
  poVar2 = std::operator<<(poVar2,psVar4);
  poVar2 = std::operator<<(poVar2," is a Catch v");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,libraryVersion);
  poVar2 = std::operator<<(poVar2,".");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,DAT_00221524);
  poVar2 = std::operator<<(poVar2," b");
  std::ostream::operator<<(poVar2,DAT_00221528);
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  if (bVar1) {
    poVar2 = std::operator<<(*(ostream **)(in_RDI + 0x168)," (");
    in_stack_ffffffffffffff70 =
         (Option<Catch::TestRunInfo> *)std::operator<<(poVar2,(string *)&DAT_00221530);
    std::operator<<((ostream *)in_stack_ffffffffffffff70,")");
  }
  poVar2 = std::operator<<(*(ostream **)(in_RDI + 0x168)," host application.\n");
  std::operator<<(poVar2,"Run with -? for options\n\n");
  Option<Catch::TestRunInfo>::reset(in_stack_ffffffffffffff70);
  Colour::~Colour((Colour *)0x1f08e6);
  return;
}

Assistant:

void lazyPrintRunInfo() {
            stream  << "\n" << getTildes() << "\n";
            Colour colour( Colour::SecondaryText );
            stream  << testRunInfo->name
                    << " is a Catch v"  << libraryVersion.majorVersion << "."
                    << libraryVersion.minorVersion << " b"
                    << libraryVersion.buildNumber;
            if( libraryVersion.branchName != "master" )
                stream << " (" << libraryVersion.branchName << ")";
            stream  << " host application.\n"
                    << "Run with -? for options\n\n";

            testRunInfo.reset();
        }